

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

_Bool container_nonzero_cardinality(container_t *c,uint8_t typecode)

{
  uint8_t in_SIL;
  container_t *in_RDI;
  uint8_t local_11;
  array_container_t *local_10;
  _Bool local_1;
  
  local_11 = in_SIL;
  local_10 = (array_container_t *)container_unwrap_shared(in_RDI,&local_11);
  if (local_11 == '\x01') {
    local_1 = bitset_container_const_nonzero_cardinality((bitset_container_t *)0x103f29);
  }
  else if (local_11 == '\x02') {
    local_1 = array_container_nonzero_cardinality(local_10);
  }
  else {
    local_1 = run_container_nonzero_cardinality((run_container_t *)local_10);
  }
  return local_1;
}

Assistant:

static inline bool container_nonzero_cardinality(const container_t *c,
                                                 uint8_t typecode) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_const_nonzero_cardinality(
                const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_nonzero_cardinality(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_nonzero_cardinality(const_CAST_run(c));
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}